

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O2

int hostkey_method_ssh_rsa_sha2_256_sig_verify
              (LIBSSH2_SESSION *session,uchar *sig,size_t sig_len,uchar *m,size_t m_len,
              void **abstract)

{
  int iVar1;
  
  if (sig_len < 0x14) {
    return -1;
  }
  iVar1 = _libssh2_rsa_sha2_verify((RSA *)*abstract,0x20,sig + 0x14,sig_len - 0x14,m,m_len);
  return iVar1;
}

Assistant:

static int
hostkey_method_ssh_rsa_sha2_256_sig_verify(LIBSSH2_SESSION * session,
                                           const unsigned char *sig,
                                           size_t sig_len,
                                           const unsigned char *m,
                                           size_t m_len, void **abstract)
{
    libssh2_rsa_ctx *rsactx = (libssh2_rsa_ctx *) (*abstract);
    (void)session;

    /* Skip past keyname_len(4) + keyname(12){"rsa-sha2-256"} +
       signature_len(4) */
    if(sig_len < 20)
        return -1;

    sig += 20;
    sig_len -= 20;
    return _libssh2_rsa_sha2_verify(rsactx, SHA256_DIGEST_LENGTH, sig, sig_len,
                                    m, m_len);
}